

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  string *psVar10;
  bool bVar11;
  pointer pbVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  bool bVar14;
  int retVal;
  cmCommand *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  string command;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string output;
  string local_70;
  string local_50;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&coutput,"called with incorrect number of arguments",
               (allocator<char> *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,&coutput);
    std::__cxx11::string::~string((string *)&coutput);
    bVar14 = false;
  }
  else {
    arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
    arguments._M_string_length = 0;
    arguments.field_2._M_local_buf[0] = '\0';
    output_variable._M_dataplus._M_p = (pointer)&output_variable.field_2;
    output_variable._M_string_length = 0;
    return_variable._M_dataplus._M_p = (pointer)&return_variable.field_2;
    return_variable._M_string_length = 0;
    output_variable.field_2._M_local_buf[0] = '\0';
    bVar5 = false;
    return_variable.field_2._M_local_buf[0] = '\0';
    iVar9 = 0;
    bVar11 = false;
    bVar4 = false;
    local_190 = &this->super_cmCommand;
    local_188 = args;
    for (; pvVar13 = local_188, bVar14 = pbVar12 == pbVar1, !bVar14; pbVar12 = pbVar12 + 1) {
      bVar3 = std::operator==(pbVar12,"OUTPUT_VARIABLE");
      if (bVar3) {
        iVar9 = iVar9 + 1;
LAB_00172162:
        bVar5 = false;
LAB_00172169:
        bVar11 = false;
      }
      else if (bVar4 == false) {
        bVar4 = std::operator==(pbVar12,"RETURN_VALUE");
        if (!bVar4) {
          if (bVar11) {
            if (return_variable._M_string_length != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&coutput,"called with incorrect number of arguments",
                         (allocator<char> *)&command);
              cmCommand::SetError(local_190,&coutput);
              goto LAB_001724e7;
            }
            std::__cxx11::string::_M_assign((string *)&return_variable);
            iVar9 = iVar9 + 1;
          }
          else {
            bVar14 = std::operator==(pbVar12,"ARGS");
            if (!bVar14) {
              if (!bVar5) goto LAB_00172162;
              std::__cxx11::string::append((string *)&arguments);
              std::__cxx11::string::append((char *)&arguments);
            }
            iVar9 = iVar9 + 1;
            bVar5 = true;
          }
          goto LAB_00172169;
        }
        iVar9 = iVar9 + 1;
        bVar11 = true;
        bVar5 = false;
      }
      else {
        if (output_variable._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&coutput,"called with incorrect number of arguments",
                     (allocator<char> *)&command);
          cmCommand::SetError(local_190,&coutput);
LAB_001724e7:
          psVar10 = &coutput;
          goto LAB_001724ef;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
        iVar9 = iVar9 + 1;
      }
      bVar4 = bVar3;
    }
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    if (arguments._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&command);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath
                (&coutput,(local_188->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::operator=((string *)&command,(string *)&coutput);
      std::__cxx11::string::~string((string *)&coutput);
      std::__cxx11::string::append((char *)&command);
      pvVar13 = local_188;
      std::__cxx11::string::append((string *)&command);
    }
    sVar2 = output_variable._M_string_length;
    retVal = 0;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pbVar12 = (pvVar13->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(pvVar13->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) - (long)iVar9 == 2)
    {
      cmsys::SystemTools::MakeDirectory(pbVar12 + 1,(mode_t *)0x0);
      std::__cxx11::string::string((string *)&local_50,(string *)&command);
      bVar5 = RunCommand(&local_50,&output,&retVal,
                         (pvVar13->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar2 == 0,
                         Auto);
      psVar10 = &local_50;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&command);
      bVar5 = RunCommand(&local_70,&output,&retVal,(char *)0x0,sVar2 == 0,Auto);
      psVar10 = &local_70;
    }
    std::__cxx11::string::~string((string *)psVar10);
    if (bVar5 == false) {
      retVal = -1;
    }
    if (output_variable._M_string_length != 0) {
      uVar6 = std::__cxx11::string::find_first_not_of((char *)&output,0x41de70);
      lVar7 = std::__cxx11::string::find_last_not_of((char *)&output,0x41de70);
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = 0;
      }
      lVar8 = output._M_string_length - 1;
      if (lVar7 != -1) {
        lVar8 = lVar7;
      }
      std::__cxx11::string::string((string *)&coutput,(string *)&output,uVar6,(lVar8 - uVar6) + 1);
      cmMakefile::AddDefinition(local_190->Makefile,&output_variable,coutput._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&coutput);
    }
    if (return_variable._M_string_length != 0) {
      sprintf((char *)&coutput,"%d",(ulong)(uint)retVal);
      cmMakefile::AddDefinition(local_190->Makefile,&return_variable,(char *)&coutput);
    }
    std::__cxx11::string::~string((string *)&output);
    psVar10 = &command;
LAB_001724ef:
    std::__cxx11::string::~string((string *)psVar10);
    std::__cxx11::string::~string((string *)&return_variable);
    std::__cxx11::string::~string((string *)&output_variable);
    std::__cxx11::string::~string((string *)&arguments);
  }
  return bVar14;
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command, output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command, output, retVal, nullptr,
                                              verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}